

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int ARKStepGetCurrentGamma(void *arkode_mem,realtype *gamma)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,(char *)0x0,&local_10,&local_18);
  if (iVar1 == 0) {
    *gamma = local_18->gamma;
  }
  return iVar1;
}

Assistant:

int ARKStepGetCurrentGamma(void *arkode_mem, realtype *gamma)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  retval = arkStep_AccessStepMem(arkode_mem, NULL, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);
  *gamma = step_mem->gamma;
  return(retval);
}